

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForEachStatement.cpp
# Opt level: O2

void __thiscall
hdc::ForEachStatement::ForEachStatement
          (ForEachStatement *this,Expression *e1,Expression *e2,CompoundStatement *statements)

{
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019aff0;
  this->e1 = e1;
  this->e2 = e2;
  this->statements = statements;
  ASTNode::setKind((ASTNode *)this,AST_FOREACH);
  if (e1 != (Expression *)0x0) {
    ASTNode::setParentNode((ASTNode *)e1,(ASTNode *)this);
  }
  if (e2 != (Expression *)0x0) {
    ASTNode::setParentNode((ASTNode *)e2,(ASTNode *)this);
  }
  if (statements != (CompoundStatement *)0x0) {
    ASTNode::setParentNode((ASTNode *)statements,(ASTNode *)this);
  }
  return;
}

Assistant:

ForEachStatement::ForEachStatement(Expression* e1, Expression* e2, CompoundStatement* statements) {
    this->e1 = e1;
    this->e2 = e2;
    this->statements = statements;
    setKind(AST_FOREACH);

    if (e1 != nullptr) {
        e1->setParentNode(this);
    }

    if (e2 != nullptr) {
        e2->setParentNode(this);
    }

    if (statements != nullptr) {
        statements->setParentNode(this);
    }
}